

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_simple.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  ALLEGRO_SAMPLE_ID sample_id;
  ALLEGRO_SAMPLE_ID new_sample_id;
  ALLEGRO_SAMPLE *sample_data [10];
  ALLEGRO_EVENT event;
  undefined8 local_e0;
  long local_d8;
  undefined8 local_d0;
  long local_c8 [10];
  int local_78 [8];
  int local_58;
  int local_54;
  uint local_50;
  
  local_c8[8] = 0;
  local_c8[9] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  cVar4 = al_install_system(0x85020700,atexit);
  if (cVar4 == '\0') {
    pcVar10 = "Could not init Allegro.\n";
  }
  else {
    if (argc < 2) {
      lVar6 = 0;
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n",
                 *argv);
LAB_001027e3:
      al_destroy_display(lVar6);
      return 0;
    }
    al_install_keyboard();
    lVar6 = al_create_display(0x280,0x1e0);
    if (lVar6 == 0) {
      pcVar10 = "Could not create display\n";
    }
    else {
      uVar7 = al_create_timer(0x11111111);
      al_start_timer(uVar7);
      uVar8 = al_create_event_queue();
      uVar9 = al_get_keyboard_event_source();
      al_register_event_source(uVar8,uVar9);
      local_d8 = lVar6;
      uVar9 = al_get_display_event_source(lVar6);
      al_register_event_source(uVar8,uVar9);
      uVar7 = al_get_timer_event_source(uVar7);
      al_register_event_source(uVar8,uVar7);
      al_init_acodec_addon();
      cVar4 = al_install_audio();
      if (cVar4 != '\0') {
        uVar13 = 9;
        if (argc - 2U < 9) {
          uVar13 = argc - 2U;
        }
        bVar14 = false;
        bVar2 = false;
        do {
          cVar4 = al_reserve_samples(0x10);
          if (cVar4 == '\0') {
            pcVar10 = "Could not set up voice and mixer.\n";
            goto LAB_00102818;
          }
          local_c8[8] = 0;
          local_c8[9] = 0;
          local_c8[6] = 0;
          local_c8[7] = 0;
          local_c8[4] = 0;
          local_c8[5] = 0;
          local_c8[2] = 0;
          local_c8[3] = 0;
          local_c8[0] = 0;
          local_c8[1] = 0;
          uVar12 = 0;
          do {
            pcVar10 = argv[uVar12 + 1];
            lVar6 = al_load_sample(pcVar10);
            local_c8[uVar12] = lVar6;
            if (lVar6 == 0) {
              log_printf("Could not load sample from \'%s\'!\n",pcVar10);
            }
            uVar12 = uVar12 + 1;
          } while (uVar13 + 1 != uVar12);
          log_printf(
                    "Press digits to play sounds.\nSpace to stop sounds.\nAdd Alt to play sounds repeatedly.\n\'p\' to pan the last played sound.\nEscape to quit.\n"
                    );
          do {
            do {
              while( true ) {
                al_wait_for_event(uVar8,local_78);
                lVar6 = local_d8;
                if (local_78[0] != 0x1e) break;
                if (!(bool)(~bVar2 | ~bVar14)) {
                  lVar6 = al_lock_sample_id(&local_e0);
                  if (lVar6 != 0) {
                    dVar1 = (double)al_get_time();
                    dVar1 = sin(dVar1);
                    al_set_sample_instance_pan((float)dVar1,lVar6);
                  }
                  al_unlock_sample_id(&local_e0);
                }
              }
              if (local_78[0] == 0x2a) goto LAB_001027b0;
            } while (local_78[0] != 0xb);
            if (local_58 == 0x3b) {
LAB_001027b0:
              uVar12 = 0;
              do {
                if (local_c8[uVar12] != 0) {
                  al_destroy_sample();
                }
              } while (((long)(uVar12 + 1) < (long)(argc + -1)) &&
                      (bVar14 = uVar12 < 9, uVar12 = uVar12 + 1, bVar14));
              al_uninstall_audio();
              goto LAB_001027e3;
            }
            if (local_54 == 0x20) {
              log_printf("Stopping all sounds\n");
              al_stop_samples();
            }
            uVar3 = local_50;
            if (local_54 - 0x30U < 10) {
              uVar11 = (local_54 - 0x27U) % 10;
              if (local_c8[uVar11] != 0) {
                cVar4 = al_play_sample(0x3f800000,0,0x3f800000,local_c8[uVar11],
                                       0x101 - (uint)((local_50 & 4) == 0),&local_d0);
                if (cVar4 == '\0') {
                  log_printf("al_play_sample_data failed, perhaps too many sounds\n");
                }
                else {
                  pcVar10 = "repeatedly";
                  if ((uVar3 & 4) == 0) {
                    pcVar10 = "once";
                  }
                  log_printf("Playing %d %s\n",(ulong)uVar11,pcVar10);
                }
                if (!bVar14) {
                  if (cVar4 == '\x01') {
                    local_e0 = local_d0;
                    bVar2 = true;
                  }
                }
              }
            }
            if ((local_54 == 0x70) && (bVar2)) {
              pcVar10 = "Panning\n";
              if (bVar14) {
                pcVar10 = "Not panning\n";
              }
              log_printf(pcVar10);
              bVar14 = (bool)(bVar14 ^ 1);
            }
          } while (local_54 != 0x72);
          uVar12 = 0;
          do {
            if (local_c8[uVar12] != 0) {
              al_destroy_sample();
            }
            uVar12 = uVar12 + 1;
          } while (uVar13 + 1 != uVar12);
          al_uninstall_audio();
          cVar4 = al_install_audio();
        } while (cVar4 != '\0');
      }
      pcVar10 = "Could not init sound!\n";
    }
  }
LAB_00102818:
  abort_example(pcVar10);
  iVar5 = __cxa_atexit();
  return iVar5;
}

Assistant:

int main(int argc, const char *argv[])
{
   ALLEGRO_SAMPLE *sample_data[MAX_SAMPLE_DATA] = {NULL};
   ALLEGRO_DISPLAY *display = NULL;
   ALLEGRO_EVENT_QUEUE *event_queue;
   ALLEGRO_EVENT event;
   ALLEGRO_SAMPLE_ID sample_id;
   bool sample_id_valid = false;
   ALLEGRO_TIMER* timer;
   int i;
   bool panning = false;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n", argv[0]);
      goto done;
   }
   argc--;
   argv++;

   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display\n");
   }

   timer = al_create_timer(1/60.0);
   al_start_timer(timer);
   event_queue = al_create_event_queue();
   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_timer_event_source(timer));

   al_init_acodec_addon();

Restart:

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(RESERVED_SAMPLES)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   memset(sample_data, 0, sizeof(sample_data));
   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      const char *filename = argv[i];

      /* Load the entire sound file from disk. */
      sample_data[i] = al_load_sample(argv[i]);
      if (!sample_data[i]) {
         log_printf("Could not load sample from '%s'!\n", filename);
         continue;
      }
   }

   log_printf(
      "Press digits to play sounds.\n"
      "Space to stop sounds.\n"
      "Add Alt to play sounds repeatedly.\n"
      "'p' to pan the last played sound.\n"
      "Escape to quit.\n");

   while (true) {
      al_wait_for_event(event_queue, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         if (event.keyboard.unichar == ' ') {
            log_printf("Stopping all sounds\n");
            al_stop_samples();
         }

         if (event.keyboard.unichar >= '0' && event.keyboard.unichar <= '9') {
            bool loop = event.keyboard.modifiers & ALLEGRO_KEYMOD_ALT;
            i = (event.keyboard.unichar - '0' + 9) % 10;
            if (sample_data[i]) {
               ALLEGRO_SAMPLE_ID new_sample_id;
               bool ret = al_play_sample(sample_data[i], 1.0, 0.0, 1.0,
                  loop ? ALLEGRO_PLAYMODE_LOOP : ALLEGRO_PLAYMODE_ONCE, &new_sample_id);
               if (ret) {
                  log_printf("Playing %d %s\n", i, loop ? "repeatedly" : "once");
               }
               else {
                  log_printf(
                     "al_play_sample_data failed, perhaps too many sounds\n");
               }
               if (!panning) {
                  if (ret) {
                     sample_id = new_sample_id;
                     sample_id_valid = true;
                  }
               }
            }
         }

         if (event.keyboard.unichar == 'p') {
            if (sample_id_valid) {
               panning = !panning;
               if (panning) {
                  log_printf("Panning\n");
               }
               else {
                  log_printf("Not panning\n");
               }
            }
         }

         /* Hidden feature: restart audio subsystem.
          * For debugging race conditions on shutting down the audio.
          */
         if (event.keyboard.unichar == 'r') {
            for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
               if (sample_data[i])
                  al_destroy_sample(sample_data[i]);
            }
            al_uninstall_audio();
            goto Restart;
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         if (panning && sample_id_valid) {
            ALLEGRO_SAMPLE_INSTANCE* instance = al_lock_sample_id(&sample_id);
            if (instance) {
               al_set_sample_instance_pan(instance, sin(al_get_time()));
            }
            al_unlock_sample_id(&sample_id);
         }
      }
   }

   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      if (sample_data[i])
         al_destroy_sample(sample_data[i]);
   }

   /* Sample data and other objects will be automatically freed. */
   al_uninstall_audio();

done:
   al_destroy_display(display);
   close_log(false);
   return 0;
}